

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

uint8 * google::protobuf::internal::WireFormat::InternalSerializeField
                  (FieldDescriptor *field,Message *message,uint8 *target,EpsCopyOutputStream *stream
                  )

{
  int iVar1;
  bool bVar2;
  KeyValue *pKVar3;
  bool bVar4;
  undefined1 uVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  float fVar9;
  uint uVar10;
  LogLevel_conflict LVar11;
  uint uVar12;
  MapFieldBase *pMVar13;
  uint8 *puVar14;
  RepeatedField<double> *other;
  string *psVar15;
  double dVar16;
  EnumValueDescriptor *pEVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RepeatedField<long> *pRVar18;
  size_t sVar19;
  RepeatedField<int> *pRVar20;
  RepeatedField<unsigned_long> *pRVar21;
  RepeatedField<float> *other_00;
  RepeatedField<bool> *other_01;
  RepeatedField<unsigned_int> *pRVar22;
  LogMessage *other_02;
  long lVar23;
  ulong uVar24;
  byte bVar25;
  LogLevel_conflict LVar26;
  ulong uVar27;
  Reflection *this;
  ulong uVar28;
  size_t sVar29;
  float *pfVar30;
  double *pdVar31;
  double *pdVar32;
  float *pfVar33;
  byte *pbVar34;
  byte *pbVar35;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> sorted_key_list;
  MapValueRef map_value;
  undefined1 local_b8 [16];
  undefined1 local_a8 [64];
  ulong local_68;
  MapIterator local_60;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  if ((field[0x42] == (FieldDescriptor)0x1) &&
     (*(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x48) == '\x01')) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_b8._0_8_ = FieldDescriptor::TypeOnceInit;
      local_60.iter_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_b8,
                 (FieldDescriptor **)&local_60);
    }
    if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) &&
       (*(int *)(field + 0x3c) != 3)) {
      puVar14 = InternalSerializeMessageSetItem(field,message,target,stream);
      return puVar14;
    }
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_b8._0_8_ = FieldDescriptor::TypeOnceInit;
    local_60.iter_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_b8,
               (FieldDescriptor **)&local_60);
  }
  if ((*(int *)(field + 0x38) == 0xb) &&
     (bVar4 = FieldDescriptor::is_map_message_type(field), bVar4)) {
    pMVar13 = Reflection::GetMapData(this,message,field);
    uVar5 = MapFieldBase::IsMapValid(pMVar13);
    if ((bool)uVar5) {
      local_68 = CONCAT71(local_68._1_7_,uVar5);
      if (stream->is_serialization_deterministic_ == true) {
        MapKeySorter::SortKey
                  ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                   local_b8,message,this,field);
        if (local_b8._0_8_ != local_b8._8_8_) {
          pMVar13 = (MapFieldBase *)local_b8._0_8_;
          do {
            local_60.iter_ = (FieldDescriptor *)0x0;
            local_60.map_._0_4_ = 0;
            Reflection::InsertOrLookupMapValue
                      (this,message,field,(MapKey *)pMVar13,(MapValueRef *)&local_60);
            target = InternalSerializeMapEntry
                               (field,(MapKey *)pMVar13,(MapValueRef *)&local_60,target,stream);
            pMVar13 = (MapFieldBase *)&pMVar13->repeated_field_;
          } while (pMVar13 != (MapFieldBase *)local_b8._8_8_);
        }
        std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::~vector
                  ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                   local_b8);
      }
      else {
        Reflection::MapBegin((MapIterator *)local_b8,this,message,field);
        while( true ) {
          Reflection::MapEnd(&local_60,this,message,field);
          cVar6 = (**(code **)(((KeyValue *)local_b8._8_8_)->int64_value_ + 0x28))
                            (local_b8._8_8_,(MapIterator *)local_b8,&local_60);
          MapIterator::~MapIterator(&local_60);
          if (cVar6 != '\0') break;
          target = InternalSerializeMapEntry
                             (field,(MapKey *)local_a8,(MapValueRef *)(local_a8 + 0x10),target,
                              stream);
          (**(code **)(((KeyValue *)local_b8._8_8_)->int64_value_ + 0x90))
                    (local_b8._8_8_,(MapIterator *)local_b8);
        }
        MapIterator::~MapIterator((MapIterator *)local_b8);
      }
      uVar5 = (undefined1)local_68;
    }
    if (uVar5 != STATE_MODIFIED_MAP) {
      return (uint8 *)(double *)target;
    }
  }
  if (*(int *)(field + 0x3c) == 3) {
    uVar7 = Reflection::FieldSize(this,message,field);
  }
  else {
    uVar7 = 1;
    if (*(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x4b) == '\0') {
      bVar4 = Reflection::HasField(this,message,field);
      uVar7 = (uint)bVar4;
    }
  }
  if ((int)uVar7 < 2) {
LAB_002a5ed4:
    local_a8._48_8_ = (MapFieldBase *)0x0;
    local_a8._56_8_ = (MapFieldBase *)0x0;
  }
  else {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_b8._0_8_ = FieldDescriptor::TypeOnceInit;
      local_60.iter_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_b8,
                 (FieldDescriptor **)&local_60);
    }
    if (((*(int *)(field + 0x38) != 0xb) ||
        (bVar4 = FieldDescriptor::is_map_message_type(field), !bVar4)) ||
       (stream->is_serialization_deterministic_ != true)) goto LAB_002a5ed4;
    DynamicMapSorter::Sort
              ((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                *)local_b8,message,uVar7,this,field);
    local_a8._56_8_ = local_b8._8_8_;
    local_a8._48_8_ = local_b8._0_8_;
  }
  bVar4 = FieldDescriptor::is_packed(field);
  if (!bVar4) {
    if (0 < (int)uVar7) {
      local_68 = (ulong)uVar7;
      uVar28 = 0;
      do {
        if (stream->end_ <= target) {
          target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
          local_b8._0_8_ = FieldDescriptor::TypeOnceInit;
          local_60.iter_ = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_b8,
                     (FieldDescriptor **)&local_60);
        }
        iVar8 = (int)uVar28;
        switch(*(undefined4 *)(field + 0x38)) {
        case 1:
          if (*(int *)(field + 0x3c) == 3) {
            dVar16 = Reflection::GetRepeatedDouble(this,message,field,iVar8);
          }
          else {
            dVar16 = Reflection::GetDouble(this,message,field);
          }
          uVar7 = *(int *)(field + 0x44) << 3;
          if (uVar7 < 0x80) {
            *target = (byte)uVar7 | 1;
            pdVar31 = (double *)((long)target + 1);
          }
          else {
            *target = (byte)uVar7 | 0x81;
            if (uVar7 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
              pdVar31 = (double *)((long)target + 2);
            }
            else {
              pdVar31 = (double *)((long)target + 2);
              uVar7 = uVar7 >> 7;
              do {
                pdVar32 = pdVar31;
                *(byte *)((long)pdVar32 + -1) = (byte)uVar7 | 0x80;
                uVar12 = uVar7 >> 7;
                pdVar31 = (double *)((long)pdVar32 + 1);
                bVar4 = 0x3fff < uVar7;
                uVar7 = uVar12;
              } while (bVar4);
              *(byte *)pdVar32 = (byte)uVar12;
            }
          }
          *pdVar31 = dVar16;
          goto LAB_002a6c8f;
        case 2:
          if (*(int *)(field + 0x3c) == 3) {
            fVar9 = Reflection::GetRepeatedFloat(this,message,field,iVar8);
          }
          else {
            fVar9 = Reflection::GetFloat(this,message,field);
          }
          uVar7 = *(int *)(field + 0x44) << 3;
          if (uVar7 < 0x80) {
            *target = (byte)uVar7 | 5;
            pfVar30 = (float *)((long)target + 1);
          }
          else {
            *target = (byte)uVar7 | 0x85;
            if (uVar7 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
              pfVar30 = (float *)((long)target + 2);
            }
            else {
              pfVar30 = (float *)((long)target + 2);
              uVar7 = uVar7 >> 7;
              do {
                pfVar33 = pfVar30;
                *(byte *)((long)pfVar33 + -1) = (byte)uVar7 | 0x80;
                uVar12 = uVar7 >> 7;
                pfVar30 = (float *)((long)pfVar33 + 1);
                bVar4 = 0x3fff < uVar7;
                uVar7 = uVar12;
              } while (bVar4);
              *(byte *)pfVar33 = (byte)uVar12;
            }
          }
          *pfVar30 = fVar9;
          goto LAB_002a6d37;
        case 3:
          if (*(int *)(field + 0x3c) == 3) {
            uVar24 = Reflection::GetRepeatedInt64(this,message,field,iVar8);
          }
          else {
            uVar24 = Reflection::GetInt64(this,message,field);
          }
          uVar7 = *(int *)(field + 0x44) << 3;
          if (uVar7 < 0x80) {
            *target = (byte)uVar7;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar7 | 0x80;
            if (uVar7 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar7 = uVar7 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar7 | 0x80;
                uVar12 = uVar7 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar7;
                uVar7 = uVar12;
              } while (bVar4);
              *pbVar34 = (byte)uVar12;
            }
          }
          if (uVar24 < 0x80) goto LAB_002a6cbf;
          *pbVar35 = (byte)uVar24 | 0x80;
          uVar27 = uVar24 >> 7;
          if (0x3fff < uVar24) {
            target = pbVar35 + 2;
            do {
              *(byte *)((long)target + -1) = (byte)uVar27 | 0x80;
              uVar24 = uVar27 >> 7;
              target = (uint8 *)((long)target + 1);
              bVar4 = 0x3fff < uVar27;
              uVar27 = uVar24;
            } while (bVar4);
            goto LAB_002a6c61;
          }
LAB_002a6c35:
          pbVar35[1] = (byte)uVar27;
LAB_002a6c39:
          target = pbVar35 + 2;
          break;
        case 4:
          if (*(int *)(field + 0x3c) == 3) {
            uVar24 = Reflection::GetRepeatedUInt64(this,message,field,iVar8);
          }
          else {
            uVar24 = Reflection::GetUInt64(this,message,field);
          }
          uVar7 = *(int *)(field + 0x44) << 3;
          if (uVar7 < 0x80) {
            *target = (byte)uVar7;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar7 | 0x80;
            if (uVar7 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar7 = uVar7 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar7 | 0x80;
                uVar12 = uVar7 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar7;
                uVar7 = uVar12;
              } while (bVar4);
              *pbVar34 = (byte)uVar12;
            }
          }
          if (uVar24 < 0x80) goto LAB_002a6cbf;
          *pbVar35 = (byte)uVar24 | 0x80;
          uVar27 = uVar24 >> 7;
          if (uVar24 < 0x4000) goto LAB_002a6c35;
          target = pbVar35 + 2;
          do {
            *(byte *)((long)target + -1) = (byte)uVar27 | 0x80;
            uVar24 = uVar27 >> 7;
            target = (uint8 *)((long)target + 1);
            bVar4 = 0x3fff < uVar27;
            uVar27 = uVar24;
          } while (bVar4);
LAB_002a6c61:
          *(byte *)((long)target + -1) = (byte)uVar24;
          break;
        case 5:
          if (*(int *)(field + 0x3c) == 3) {
            uVar7 = Reflection::GetRepeatedInt32(this,message,field,iVar8);
          }
          else {
            uVar7 = Reflection::GetInt32(this,message,field);
          }
          uVar12 = *(int *)(field + 0x44) << 3;
          if (uVar12 < 0x80) {
            *target = (byte)uVar12;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar12 | 0x80;
            if (uVar12 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar12 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar12 = uVar12 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar12 | 0x80;
                uVar10 = uVar12 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar12;
                uVar12 = uVar10;
              } while (bVar4);
              *pbVar34 = (byte)uVar10;
            }
          }
          if (0x7f < uVar7) {
            *pbVar35 = (byte)uVar7 | 0x80;
            uVar27 = (ulong)(long)(int)uVar7 >> 7;
            if (uVar7 < 0x4000) goto LAB_002a6c35;
            target = pbVar35 + 2;
            do {
              *(byte *)((long)target + -1) = (byte)uVar27 | 0x80;
              uVar24 = uVar27 >> 7;
              target = (uint8 *)((long)target + 1);
              bVar4 = 0x3fff < uVar27;
              uVar27 = uVar24;
            } while (bVar4);
            goto LAB_002a6c61;
          }
LAB_002a6a45:
          *pbVar35 = (byte)uVar7;
          goto LAB_002a6cc2;
        case 6:
          if (*(int *)(field + 0x3c) == 3) {
            dVar16 = (double)Reflection::GetRepeatedUInt64(this,message,field,iVar8);
          }
          else {
            dVar16 = (double)Reflection::GetUInt64(this,message,field);
          }
          uVar7 = *(int *)(field + 0x44) << 3;
          if (uVar7 < 0x80) {
LAB_002a6600:
            *target = (byte)uVar7 | 1;
            pdVar31 = (double *)((long)target + 1);
          }
          else {
            *target = (byte)uVar7 | 0x81;
            uVar12 = uVar7 >> 7;
            if (0x3fff < uVar7) {
              pdVar31 = (double *)((long)target + 2);
              do {
                *(byte *)((long)pdVar31 + -1) = (byte)uVar12 | 0x80;
                uVar7 = uVar12 >> 7;
                pdVar31 = (double *)((long)pdVar31 + 1);
                bVar4 = 0x3fff < uVar12;
                uVar12 = uVar7;
              } while (bVar4);
              goto LAB_002a6c88;
            }
LAB_002a68a7:
            *(byte *)((long)target + 1) = (byte)uVar12;
            pdVar31 = (double *)((long)target + 2);
          }
          goto LAB_002a6c8c;
        case 7:
          if (*(int *)(field + 0x3c) == 3) {
            fVar9 = (float)Reflection::GetRepeatedUInt32(this,message,field,iVar8);
          }
          else {
            fVar9 = (float)Reflection::GetUInt32(this,message,field);
          }
          uVar7 = *(int *)(field + 0x44) << 3;
          if (uVar7 < 0x80) {
LAB_002a6661:
            *target = (byte)uVar7 | 5;
            pfVar30 = (float *)((long)target + 1);
          }
          else {
            *target = (byte)uVar7 | 0x85;
            uVar12 = uVar7 >> 7;
            if (0x3fff < uVar7) {
              pfVar30 = (float *)((long)target + 2);
              do {
                *(byte *)((long)pfVar30 + -1) = (byte)uVar12 | 0x80;
                uVar7 = uVar12 >> 7;
                pfVar30 = (float *)((long)pfVar30 + 1);
                bVar4 = 0x3fff < uVar12;
                uVar12 = uVar7;
              } while (bVar4);
              goto LAB_002a6d30;
            }
LAB_002a68f3:
            *(byte *)((long)target + 1) = (byte)uVar12;
            pfVar30 = (float *)((long)target + 2);
          }
          goto LAB_002a6d34;
        case 8:
          if (*(int *)(field + 0x3c) == 3) {
            bVar4 = Reflection::GetRepeatedBool(this,message,field,iVar8);
          }
          else {
            bVar4 = Reflection::GetBool(this,message,field);
          }
          uVar7 = *(int *)(field + 0x44) << 3;
          if (uVar7 < 0x80) {
            *target = (byte)uVar7;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar7 | 0x80;
            if (uVar7 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar7 = uVar7 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar7 | 0x80;
                uVar12 = uVar7 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar2 = 0x3fff < uVar7;
                uVar7 = uVar12;
              } while (bVar2);
              *pbVar34 = (byte)uVar12;
            }
          }
          *pbVar35 = bVar4;
          goto LAB_002a6cc2;
        case 9:
          iVar1 = *(int *)(*(long *)(field + 0x28) + 0x3c);
          local_b8._0_8_ = local_a8;
          local_b8._8_8_ = (MapFieldBase *)0x0;
          local_a8[0] = false;
          if (*(int *)(field + 0x3c) == 3) {
            psVar15 = Reflection::GetRepeatedStringReference
                                (this,message,field,iVar8,(string *)local_b8);
          }
          else {
            psVar15 = Reflection::GetStringReference(this,message,field,(string *)local_b8);
          }
          if (iVar1 == 3) {
            WireFormatLite::VerifyUtf8String
                      ((psVar15->_M_dataplus)._M_p,(int)psVar15->_M_string_length,SERIALIZE,
                       (char *)**(undefined8 **)(field + 8));
          }
          sVar29 = psVar15->_M_string_length;
          if ((long)sVar29 < 0x80) {
            uVar7 = *(uint32 *)(field + 0x44) * 8;
            lVar23 = 1;
            if (((0x7f < uVar7) && (lVar23 = 2, 0x3fff < uVar7)) && (lVar23 = 3, 0x1fffff < uVar7))
            {
              lVar23 = 5 - (ulong)(uVar7 < 0x10000000);
            }
            if ((long)sVar29 <= (long)(stream->end_ + ~(ulong)(lVar23 + (long)target) + 0x10)) {
              if (uVar7 < 0x80) {
                *target = (byte)uVar7 | 2;
                pbVar35 = (byte *)((long)target + 1);
              }
              else {
                *target = (byte)uVar7 | 0x82;
                if (uVar7 < 0x4000) {
                  *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
                  pbVar35 = (byte *)((long)target + 2);
                }
                else {
                  pbVar35 = (byte *)((long)target + 2);
                  uVar7 = uVar7 >> 7;
                  do {
                    pbVar34 = pbVar35;
                    pbVar34[-1] = (byte)uVar7 | 0x80;
                    uVar12 = uVar7 >> 7;
                    pbVar35 = pbVar34 + 1;
                    bVar4 = 0x3fff < uVar7;
                    uVar7 = uVar12;
                  } while (bVar4);
                  *pbVar34 = (byte)uVar12;
                }
              }
              *pbVar35 = (byte)sVar29;
              memcpy(pbVar35 + 1,(psVar15->_M_dataplus)._M_p,sVar29);
              target = pbVar35 + sVar29 + 1;
              goto LAB_002a6db4;
            }
          }
          target = io::EpsCopyOutputStream::WriteStringOutline
                             (stream,*(uint32 *)(field + 0x44),psVar15,target);
          goto LAB_002a6db4;
        case 10:
          iVar1 = *(int *)(field + 0x44);
          if (*(int *)(field + 0x3c) == 3) {
            if (local_a8._48_8_ == local_a8._56_8_) {
              psVar15 = (string *)Reflection::GetRepeatedMessage(this,message,field,iVar8);
            }
            else {
              psVar15 = ((KeyValue *)local_a8._48_8_)[uVar28].string_value_;
            }
          }
          else {
            psVar15 = (string *)Reflection::GetMessage(this,message,field,(MessageFactory *)0x0);
          }
          uVar7 = iVar1 << 3;
          bVar25 = (byte)uVar7;
          if (uVar7 < 0x80) {
            *target = bVar25 | 3;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = bVar25 | 0x83;
            if (uVar7 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar12 = uVar7 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar12 | 0x80;
                uVar10 = uVar12 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar12;
                uVar12 = uVar10;
              } while (bVar4);
              *pbVar34 = (byte)uVar10;
            }
          }
          iVar8 = (**(_func_int **)((long)(psVar15->_M_dataplus)._M_p + 0x70))
                            (psVar15,pbVar35,stream);
          pbVar35 = (byte *)CONCAT44(extraout_var,iVar8);
          if (stream->end_ <= pbVar35) {
            pbVar35 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar35);
          }
          if (uVar7 < 0x80) {
            *pbVar35 = bVar25 | 4;
            goto LAB_002a6cc2;
          }
          *pbVar35 = bVar25 | 0x84;
          if (uVar7 < 0x4000) {
            pbVar35[1] = (byte)(uVar7 >> 7);
            goto LAB_002a6c39;
          }
          target = pbVar35 + 2;
          uVar7 = uVar7 >> 7;
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar7 | 0x80;
            uVar12 = uVar7 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar12;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar12;
          break;
        case 0xb:
          iVar1 = *(int *)(field + 0x44);
          if (*(int *)(field + 0x3c) == 3) {
            if (local_a8._48_8_ == local_a8._56_8_) {
              psVar15 = (string *)Reflection::GetRepeatedMessage(this,message,field,iVar8);
            }
            else {
              psVar15 = ((KeyValue *)local_a8._48_8_)[uVar28].string_value_;
            }
          }
          else {
            psVar15 = (string *)Reflection::GetMessage(this,message,field,(MessageFactory *)0x0);
          }
          uVar7 = iVar1 << 3;
          if (uVar7 < 0x80) {
            *target = (byte)uVar7 | 2;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar7 | 0x82;
            if (uVar7 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar7 = uVar7 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar7 | 0x80;
                uVar12 = uVar7 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar7;
                uVar7 = uVar12;
              } while (bVar4);
              *pbVar34 = (byte)uVar12;
            }
          }
          uVar7 = (**(_func_int **)((long)(psVar15->_M_dataplus)._M_p + 0x60))(psVar15);
          if (uVar7 < 0x80) {
            *pbVar35 = (byte)uVar7;
            pbVar35 = pbVar35 + 1;
          }
          else {
            *pbVar35 = (byte)uVar7 | 0x80;
            if (uVar7 < 0x4000) {
              pbVar35[1] = (byte)(uVar7 >> 7);
              pbVar35 = pbVar35 + 2;
            }
            else {
              pbVar35 = pbVar35 + 2;
              uVar7 = uVar7 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar7 | 0x80;
                uVar12 = uVar7 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar7;
                uVar7 = uVar12;
              } while (bVar4);
              *pbVar34 = (byte)uVar12;
            }
          }
          iVar8 = (**(_func_int **)((long)(psVar15->_M_dataplus)._M_p + 0x70))
                            (psVar15,pbVar35,stream);
          target = (uint8 *)CONCAT44(extraout_var_00,iVar8);
          break;
        case 0xc:
          local_b8._0_8_ = local_a8;
          local_b8._8_8_ = (MapFieldBase *)0x0;
          local_a8[0] = false;
          if (*(int *)(field + 0x3c) == 3) {
            psVar15 = Reflection::GetRepeatedStringReference
                                (this,message,field,iVar8,(string *)local_b8);
          }
          else {
            psVar15 = Reflection::GetStringReference(this,message,field,(string *)local_b8);
          }
          sVar29 = psVar15->_M_string_length;
          if ((long)sVar29 < 0x80) {
            uVar7 = *(uint32 *)(field + 0x44) * 8;
            lVar23 = 1;
            if (((0x7f < uVar7) && (lVar23 = 2, 0x3fff < uVar7)) && (lVar23 = 3, 0x1fffff < uVar7))
            {
              lVar23 = 5 - (ulong)(uVar7 < 0x10000000);
            }
            if ((long)sVar29 <= (long)(stream->end_ + ~(ulong)(lVar23 + (long)target) + 0x10)) {
              if (uVar7 < 0x80) {
                *target = (byte)uVar7 | 2;
                pbVar35 = (byte *)((long)target + 1);
              }
              else {
                *target = (byte)uVar7 | 0x82;
                if (uVar7 < 0x4000) {
                  *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
                  pbVar35 = (byte *)((long)target + 2);
                }
                else {
                  pbVar35 = (byte *)((long)target + 2);
                  uVar7 = uVar7 >> 7;
                  do {
                    pbVar34 = pbVar35;
                    pbVar34[-1] = (byte)uVar7 | 0x80;
                    uVar12 = uVar7 >> 7;
                    pbVar35 = pbVar34 + 1;
                    bVar4 = 0x3fff < uVar7;
                    uVar7 = uVar12;
                  } while (bVar4);
                  *pbVar34 = (byte)uVar12;
                }
              }
              *pbVar35 = (byte)sVar29;
              memcpy(pbVar35 + 1,(psVar15->_M_dataplus)._M_p,sVar29);
              target = pbVar35 + sVar29 + 1;
              goto LAB_002a6db4;
            }
          }
          target = io::EpsCopyOutputStream::WriteStringOutline
                             (stream,*(uint32 *)(field + 0x44),psVar15,target);
LAB_002a6db4:
          if ((MapFieldBase *)local_b8._0_8_ != (MapFieldBase *)local_a8) {
            operator_delete((void *)local_b8._0_8_);
          }
          break;
        case 0xd:
          if (*(int *)(field + 0x3c) == 3) {
            uVar7 = Reflection::GetRepeatedUInt32(this,message,field,iVar8);
          }
          else {
            uVar7 = Reflection::GetUInt32(this,message,field);
          }
          uVar12 = *(int *)(field + 0x44) << 3;
          if (uVar12 < 0x80) {
            *target = (byte)uVar12;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar12 | 0x80;
            if (uVar12 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar12 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar12 = uVar12 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar12 | 0x80;
                uVar10 = uVar12 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar12;
                uVar12 = uVar10;
              } while (bVar4);
              *pbVar34 = (byte)uVar10;
            }
          }
          if (uVar7 < 0x80) goto LAB_002a6a45;
          *pbVar35 = (byte)uVar7 | 0x80;
          uVar12 = uVar7 >> 7;
          if (uVar7 < 0x4000) {
LAB_002a6a61:
            pbVar35[1] = (byte)uVar12;
            goto LAB_002a6c39;
          }
          target = pbVar35 + 2;
          do {
            *(byte *)((long)target + -1) = (byte)uVar12 | 0x80;
            uVar7 = uVar12 >> 7;
            target = (uint8 *)((long)target + 1);
            bVar4 = 0x3fff < uVar12;
            uVar12 = uVar7;
          } while (bVar4);
LAB_002a6a86:
          *(byte *)((long)target + -1) = (byte)uVar7;
          break;
        case 0xe:
          if (*(int *)(field + 0x3c) == 3) {
            pEVar17 = Reflection::GetRepeatedEnum(this,message,field,iVar8);
          }
          else {
            pEVar17 = Reflection::GetEnum(this,message,field);
          }
          uVar7 = *(uint *)(pEVar17 + 0x10);
          uVar24 = (ulong)(int)uVar7;
          uVar12 = *(int *)(field + 0x44) << 3;
          if (uVar12 < 0x80) {
            *target = (byte)uVar12;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar12 | 0x80;
            if (uVar12 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar12 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar12 = uVar12 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar12 | 0x80;
                uVar10 = uVar12 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar12;
                uVar12 = uVar10;
              } while (bVar4);
              *pbVar34 = (byte)uVar10;
            }
          }
          if (uVar7 < 0x80) goto LAB_002a6cbf;
          *pbVar35 = (byte)uVar7 | 0x80;
          if (uVar7 < 0x4000) {
            pbVar35[1] = (byte)(uVar24 >> 7);
            goto LAB_002a6c39;
          }
          uVar24 = uVar24 >> 7;
          target = pbVar35 + 2;
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar24 | 0x80;
            uVar27 = uVar24 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar24;
            uVar24 = uVar27;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar27;
          break;
        case 0xf:
          if (*(int *)(field + 0x3c) == 3) {
            fVar9 = (float)Reflection::GetRepeatedInt32(this,message,field,iVar8);
          }
          else {
            fVar9 = (float)Reflection::GetInt32(this,message,field);
          }
          uVar7 = *(int *)(field + 0x44) << 3;
          if (uVar7 < 0x80) goto LAB_002a6661;
          *target = (byte)uVar7 | 0x85;
          uVar12 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_002a68f3;
          pfVar30 = (float *)((long)target + 2);
          do {
            *(byte *)((long)pfVar30 + -1) = (byte)uVar12 | 0x80;
            uVar7 = uVar12 >> 7;
            pfVar30 = (float *)((long)pfVar30 + 1);
            bVar4 = 0x3fff < uVar12;
            uVar12 = uVar7;
          } while (bVar4);
LAB_002a6d30:
          *(byte *)((long)pfVar30 + -1) = (byte)uVar7;
LAB_002a6d34:
          *pfVar30 = fVar9;
LAB_002a6d37:
          target = (uint8 *)(pfVar30 + 1);
          break;
        case 0x10:
          if (*(int *)(field + 0x3c) == 3) {
            dVar16 = (double)Reflection::GetRepeatedInt64(this,message,field,iVar8);
          }
          else {
            dVar16 = (double)Reflection::GetInt64(this,message,field);
          }
          uVar7 = *(int *)(field + 0x44) << 3;
          if (uVar7 < 0x80) goto LAB_002a6600;
          *target = (byte)uVar7 | 0x81;
          uVar12 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_002a68a7;
          pdVar31 = (double *)((long)target + 2);
          do {
            *(byte *)((long)pdVar31 + -1) = (byte)uVar12 | 0x80;
            uVar7 = uVar12 >> 7;
            pdVar31 = (double *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar12;
            uVar12 = uVar7;
          } while (bVar4);
LAB_002a6c88:
          *(byte *)((long)pdVar31 + -1) = (byte)uVar7;
LAB_002a6c8c:
          *pdVar31 = dVar16;
LAB_002a6c8f:
          target = (uint8 *)(pdVar31 + 1);
          break;
        case 0x11:
          if (*(int *)(field + 0x3c) == 3) {
            iVar8 = Reflection::GetRepeatedInt32(this,message,field,iVar8);
          }
          else {
            iVar8 = Reflection::GetInt32(this,message,field);
          }
          uVar7 = *(int *)(field + 0x44) << 3;
          if (uVar7 < 0x80) {
            *target = (byte)uVar7;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar7 | 0x80;
            if (uVar7 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar7 = uVar7 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar7 | 0x80;
                uVar12 = uVar7 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar7;
                uVar7 = uVar12;
              } while (bVar4);
              *pbVar34 = (byte)uVar12;
            }
          }
          uVar7 = iVar8 >> 0x1f ^ iVar8 * 2;
          uVar24 = (ulong)uVar7;
          if (0x7f < uVar7) {
            *pbVar35 = (byte)uVar7 | 0x80;
            uVar12 = uVar7 >> 7;
            if (uVar7 < 0x4000) goto LAB_002a6a61;
            target = pbVar35 + 2;
            do {
              *(byte *)((long)target + -1) = (byte)uVar12 | 0x80;
              uVar7 = uVar12 >> 7;
              target = (uint8 *)((long)target + 1);
              bVar4 = 0x3fff < uVar12;
              uVar12 = uVar7;
            } while (bVar4);
            goto LAB_002a6a86;
          }
          goto LAB_002a6cbf;
        case 0x12:
          if (*(int *)(field + 0x3c) == 3) {
            lVar23 = Reflection::GetRepeatedInt64(this,message,field,iVar8);
          }
          else {
            lVar23 = Reflection::GetInt64(this,message,field);
          }
          uVar7 = *(int *)(field + 0x44) << 3;
          if (uVar7 < 0x80) {
            *target = (byte)uVar7;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar7 | 0x80;
            if (uVar7 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar7 = uVar7 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar7 | 0x80;
                uVar12 = uVar7 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar7;
                uVar7 = uVar12;
              } while (bVar4);
              *pbVar34 = (byte)uVar12;
            }
          }
          uVar24 = lVar23 >> 0x3f ^ lVar23 * 2;
          if (0x7f < uVar24) {
            *pbVar35 = (byte)uVar24 | 0x80;
            uVar27 = uVar24 >> 7;
            if (uVar24 < 0x4000) goto LAB_002a6c35;
            target = pbVar35 + 2;
            do {
              *(byte *)((long)target + -1) = (byte)uVar27 | 0x80;
              uVar24 = uVar27 >> 7;
              target = (uint8 *)((long)target + 1);
              bVar4 = 0x3fff < uVar27;
              uVar27 = uVar24;
            } while (bVar4);
            goto LAB_002a6c61;
          }
LAB_002a6cbf:
          *pbVar35 = (byte)uVar24;
LAB_002a6cc2:
          target = pbVar35 + 1;
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != local_68);
    }
    goto LAB_002a793b;
  }
  if (uVar7 == 0) goto LAB_002a793b;
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_b8._0_8_ = FieldDescriptor::TypeOnceInit;
    local_60.iter_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_b8,
               (FieldDescriptor **)&local_60);
  }
  switch(*(undefined4 *)(field + 0x38)) {
  case 1:
    other = Reflection::GetRepeatedField<double>(this,message,field);
    RepeatedField<double>::RepeatedField((RepeatedField<double> *)local_b8,other);
    iVar8 = *(int *)(field + 0x44);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = local_b8._0_4_ << 3;
    uVar12 = iVar8 << 3;
    if (uVar12 < 0x80) {
      *target = (byte)uVar12 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar12 | 0x82;
      if (uVar12 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar12 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar12 = uVar12 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar12 | 0x80;
          uVar10 = uVar12 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar12;
          uVar12 = uVar10;
        } while (bVar4);
        *pbVar34 = (byte)uVar10;
      }
    }
    uVar12 = uVar7;
    uVar10 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar35 = (byte)uVar10 | 0x80;
        pbVar35 = pbVar35 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar12 = uVar10 >> 7;
        uVar10 = uVar10 >> 7;
      } while (bVar4);
    }
    *pbVar35 = (byte)uVar12;
    pbVar35 = pbVar35 + 1;
    sVar29 = (size_t)(int)uVar7;
    if ((long)stream->end_ - (long)pbVar35 < (long)sVar29) {
      target = io::EpsCopyOutputStream::WriteRawFallback
                         (stream,(void *)local_b8._8_8_,uVar7,pbVar35);
    }
    else {
      memcpy(pbVar35,(void *)local_b8._8_8_,sVar29);
      target = pbVar35 + sVar29;
    }
    RepeatedField<double>::~RepeatedField((RepeatedField<double> *)local_b8);
    break;
  case 2:
    other_00 = Reflection::GetRepeatedField<float>(this,message,field);
    RepeatedField<float>::RepeatedField((RepeatedField<float> *)local_b8,other_00);
    iVar8 = *(int *)(field + 0x44);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = local_b8._0_4_ << 2;
    uVar12 = iVar8 << 3;
    if (uVar12 < 0x80) {
      *target = (byte)uVar12 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar12 | 0x82;
      if (uVar12 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar12 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar12 = uVar12 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar12 | 0x80;
          uVar10 = uVar12 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar12;
          uVar12 = uVar10;
        } while (bVar4);
        *pbVar34 = (byte)uVar10;
      }
    }
    uVar12 = uVar7;
    uVar10 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar35 = (byte)uVar10 | 0x80;
        pbVar35 = pbVar35 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar12 = uVar10 >> 7;
        uVar10 = uVar10 >> 7;
      } while (bVar4);
    }
    *pbVar35 = (byte)uVar12;
    pbVar35 = pbVar35 + 1;
    sVar29 = (size_t)(int)uVar7;
    if ((long)stream->end_ - (long)pbVar35 < (long)sVar29) {
      target = io::EpsCopyOutputStream::WriteRawFallback
                         (stream,(void *)local_b8._8_8_,uVar7,pbVar35);
    }
    else {
      memcpy(pbVar35,(void *)local_b8._8_8_,sVar29);
      target = pbVar35 + sVar29;
    }
    RepeatedField<float>::~RepeatedField((RepeatedField<float> *)local_b8);
    break;
  case 3:
    pRVar18 = Reflection::GetRepeatedField<long>(this,message,field);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)local_b8,pRVar18);
    iVar8 = *(int *)(field + 0x44);
    sVar19 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = iVar8 << 3;
    if (uVar7 < 0x80) {
      *target = (byte)uVar7 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar7 = uVar7 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar7 | 0x80;
          uVar12 = uVar7 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar12;
        } while (bVar4);
        *pbVar34 = (byte)uVar12;
      }
    }
    if ((uint)sVar19 < 0x80) {
      uVar28 = sVar19 & 0xffffffff;
    }
    else {
      uVar28 = sVar19 & 0xffffffff;
      do {
        uVar7 = (uint)sVar19;
        *pbVar35 = (byte)sVar19 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar35 = pbVar35 + 1;
        sVar19 = uVar28;
      } while (0x3fff < uVar7);
    }
    *pbVar35 = (byte)uVar28;
    target = pbVar35 + 1;
    lVar23 = (long)(int)local_b8._0_4_;
    pKVar3 = (KeyValue *)local_b8._8_8_;
    pMVar13 = (MapFieldBase *)local_b8._8_8_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar28 = ((KeyValue *)&pMVar13->_vptr_MapFieldBase)->uint64_value_;
      if (uVar28 < 0x80) {
        *target = (byte)uVar28;
        target = (uint8 *)((long)target + 1);
      }
      else {
        *target = (byte)uVar28 | 0x80;
        if (uVar28 < 0x4000) {
          *(byte *)((long)target + 1) = (byte)(uVar28 >> 7);
          target = (uint8 *)((long)target + 2);
        }
        else {
          uVar28 = uVar28 >> 7;
          target = (uint8 *)((long)target + 2);
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar28 | 0x80;
            uVar24 = uVar28 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar28;
            uVar28 = uVar24;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar24;
        }
      }
      pMVar13 = (MapFieldBase *)&pMVar13->arena_;
    } while (pMVar13 < pKVar3 + lVar23);
    goto LAB_002a7788;
  case 4:
    pRVar21 = Reflection::GetRepeatedField<unsigned_long>(this,message,field);
    RepeatedField<unsigned_long>::RepeatedField((RepeatedField<unsigned_long> *)local_b8,pRVar21);
    iVar8 = *(int *)(field + 0x44);
    sVar19 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = iVar8 << 3;
    if (uVar7 < 0x80) {
      *target = (byte)uVar7 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar7 = uVar7 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar7 | 0x80;
          uVar12 = uVar7 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar12;
        } while (bVar4);
        *pbVar34 = (byte)uVar12;
      }
    }
    if ((uint)sVar19 < 0x80) {
      uVar28 = sVar19 & 0xffffffff;
    }
    else {
      uVar28 = sVar19 & 0xffffffff;
      do {
        uVar7 = (uint)sVar19;
        *pbVar35 = (byte)sVar19 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar35 = pbVar35 + 1;
        sVar19 = uVar28;
      } while (0x3fff < uVar7);
    }
    *pbVar35 = (byte)uVar28;
    target = pbVar35 + 1;
    lVar23 = (long)(int)local_b8._0_4_;
    pKVar3 = (KeyValue *)local_b8._8_8_;
    pMVar13 = (MapFieldBase *)local_b8._8_8_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar28 = ((KeyValue *)&pMVar13->_vptr_MapFieldBase)->uint64_value_;
      if (uVar28 < 0x80) {
        *target = (byte)uVar28;
        target = (uint8 *)((long)target + 1);
      }
      else {
        *target = (byte)uVar28 | 0x80;
        if (uVar28 < 0x4000) {
          *(byte *)((long)target + 1) = (byte)(uVar28 >> 7);
          target = (uint8 *)((long)target + 2);
        }
        else {
          uVar28 = uVar28 >> 7;
          target = (uint8 *)((long)target + 2);
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar28 | 0x80;
            uVar24 = uVar28 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar28;
            uVar28 = uVar24;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar24;
        }
      }
      pMVar13 = (MapFieldBase *)&pMVar13->arena_;
    } while (pMVar13 < pKVar3 + lVar23);
    goto LAB_002a771d;
  case 5:
    pRVar20 = Reflection::GetRepeatedField<int>(this,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)local_b8,pRVar20);
    iVar8 = *(int *)(field + 0x44);
    sVar19 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = iVar8 << 3;
    if (uVar7 < 0x80) {
      *target = (byte)uVar7 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar7 = uVar7 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar7 | 0x80;
          uVar12 = uVar7 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar12;
        } while (bVar4);
        *pbVar34 = (byte)uVar12;
      }
    }
    if ((uint)sVar19 < 0x80) {
      uVar28 = sVar19 & 0xffffffff;
    }
    else {
      uVar28 = sVar19 & 0xffffffff;
      do {
        uVar7 = (uint)sVar19;
        *pbVar35 = (byte)sVar19 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar35 = pbVar35 + 1;
        sVar19 = uVar28;
      } while (0x3fff < uVar7);
    }
    *pbVar35 = (byte)uVar28;
    target = pbVar35 + 1;
    lVar23 = (long)(int)local_b8._0_4_;
    pKVar3 = (KeyValue *)local_b8._8_8_;
    pMVar13 = (MapFieldBase *)local_b8._8_8_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar7 = ((KeyValue *)&pMVar13->_vptr_MapFieldBase)->uint32_value_;
      if ((ulong)(long)(int)uVar7 < 0x80) {
        *target = (byte)uVar7;
        target = (uint8 *)((long)target + 1);
      }
      else {
        *target = (byte)uVar7 | 0x80;
        uVar28 = (ulong)(long)(int)uVar7 >> 7;
        if (uVar7 < 0x4000) {
          *(byte *)((long)target + 1) = (byte)uVar28;
          target = (uint8 *)((long)target + 2);
        }
        else {
          target = (uint8 *)((long)target + 2);
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar28 | 0x80;
            uVar24 = uVar28 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar28;
            uVar28 = uVar24;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar24;
        }
      }
      pMVar13 = (MapFieldBase *)((long)&pMVar13->_vptr_MapFieldBase + 4);
    } while (pMVar13 < (MapFieldBase *)((long)pKVar3 + lVar23 * 4));
    goto LAB_002a76b2;
  case 6:
    pRVar21 = Reflection::GetRepeatedField<unsigned_long>(this,message,field);
    RepeatedField<unsigned_long>::RepeatedField((RepeatedField<unsigned_long> *)local_b8,pRVar21);
    iVar8 = *(int *)(field + 0x44);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = local_b8._0_4_ << 3;
    uVar12 = iVar8 << 3;
    if (uVar12 < 0x80) {
      *target = (byte)uVar12 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar12 | 0x82;
      if (uVar12 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar12 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar12 = uVar12 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar12 | 0x80;
          uVar10 = uVar12 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar12;
          uVar12 = uVar10;
        } while (bVar4);
        *pbVar34 = (byte)uVar10;
      }
    }
    uVar12 = uVar7;
    uVar10 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar35 = (byte)uVar10 | 0x80;
        pbVar35 = pbVar35 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar12 = uVar10 >> 7;
        uVar10 = uVar10 >> 7;
      } while (bVar4);
    }
    *pbVar35 = (byte)uVar12;
    pbVar35 = pbVar35 + 1;
    sVar29 = (size_t)(int)uVar7;
    if ((long)stream->end_ - (long)pbVar35 < (long)sVar29) {
      target = io::EpsCopyOutputStream::WriteRawFallback
                         (stream,(void *)local_b8._8_8_,uVar7,pbVar35);
    }
    else {
      memcpy(pbVar35,(void *)local_b8._8_8_,sVar29);
      target = pbVar35 + sVar29;
    }
LAB_002a771d:
    RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)local_b8);
    break;
  case 7:
    pRVar22 = Reflection::GetRepeatedField<unsigned_int>(this,message,field);
    RepeatedField<unsigned_int>::RepeatedField((RepeatedField<unsigned_int> *)local_b8,pRVar22);
    iVar8 = *(int *)(field + 0x44);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = local_b8._0_4_ << 2;
    uVar12 = iVar8 << 3;
    if (uVar12 < 0x80) {
      *target = (byte)uVar12 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar12 | 0x82;
      if (uVar12 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar12 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar12 = uVar12 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar12 | 0x80;
          uVar10 = uVar12 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar12;
          uVar12 = uVar10;
        } while (bVar4);
        *pbVar34 = (byte)uVar10;
      }
    }
    uVar12 = uVar7;
    uVar10 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar35 = (byte)uVar10 | 0x80;
        pbVar35 = pbVar35 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar12 = uVar10 >> 7;
        uVar10 = uVar10 >> 7;
      } while (bVar4);
    }
    *pbVar35 = (byte)uVar12;
    pbVar35 = pbVar35 + 1;
    sVar29 = (size_t)(int)uVar7;
    if ((long)stream->end_ - (long)pbVar35 < (long)sVar29) {
      target = io::EpsCopyOutputStream::WriteRawFallback
                         (stream,(void *)local_b8._8_8_,uVar7,pbVar35);
    }
    else {
      memcpy(pbVar35,(void *)local_b8._8_8_,sVar29);
      target = pbVar35 + sVar29;
    }
    goto LAB_002a78c9;
  case 8:
    other_01 = Reflection::GetRepeatedField<bool>(this,message,field);
    RepeatedField<bool>::RepeatedField((RepeatedField<bool> *)local_b8,other_01);
    iVar8 = *(int *)(field + 0x44);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = iVar8 << 3;
    if (uVar7 < 0x80) {
      *target = (byte)uVar7 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar7 = uVar7 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar7 | 0x80;
          uVar12 = uVar7 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar12;
        } while (bVar4);
        *pbVar34 = (byte)uVar12;
      }
    }
    sVar29 = (size_t)(int)local_b8._0_4_;
    LVar11 = local_b8._0_4_;
    LVar26 = local_b8._0_4_;
    if (0x7f < (uint)local_b8._0_4_) {
      do {
        *pbVar35 = (byte)LVar26 | 0x80;
        pbVar35 = pbVar35 + 1;
        bVar4 = 0x3fff < LVar26;
        LVar11 = LVar26 >> 7;
        LVar26 = LVar26 >> 7;
      } while (bVar4);
    }
    *pbVar35 = (byte)LVar11;
    pbVar35 = pbVar35 + 1;
    if ((long)stream->end_ - (long)pbVar35 < (long)sVar29) {
      target = io::EpsCopyOutputStream::WriteRawFallback
                         (stream,(void *)local_b8._8_8_,local_b8._0_4_,pbVar35);
    }
    else {
      memcpy(pbVar35,(void *)local_b8._8_8_,sVar29);
      target = pbVar35 + sVar29;
    }
    RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)local_b8);
    break;
  default:
    LogMessage::LogMessage
              ((LogMessage *)local_b8,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format.cc"
               ,0x3ac);
    other_02 = LogMessage::operator<<((LogMessage *)local_b8,"Invalid descriptor");
    LogFinisher::operator=((LogFinisher *)&local_60,other_02);
    LogMessage::~LogMessage((LogMessage *)local_b8);
    break;
  case 0xd:
    pRVar22 = Reflection::GetRepeatedField<unsigned_int>(this,message,field);
    RepeatedField<unsigned_int>::RepeatedField((RepeatedField<unsigned_int> *)local_b8,pRVar22);
    iVar8 = *(int *)(field + 0x44);
    sVar19 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = iVar8 << 3;
    if (uVar7 < 0x80) {
      *target = (byte)uVar7 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar7 = uVar7 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar7 | 0x80;
          uVar12 = uVar7 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar12;
        } while (bVar4);
        *pbVar34 = (byte)uVar12;
      }
    }
    if ((uint)sVar19 < 0x80) {
      uVar28 = sVar19 & 0xffffffff;
    }
    else {
      uVar28 = sVar19 & 0xffffffff;
      do {
        uVar7 = (uint)sVar19;
        *pbVar35 = (byte)sVar19 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar35 = pbVar35 + 1;
        sVar19 = uVar28;
      } while (0x3fff < uVar7);
    }
    *pbVar35 = (byte)uVar28;
    target = pbVar35 + 1;
    lVar23 = (long)(int)local_b8._0_4_;
    pKVar3 = (KeyValue *)local_b8._8_8_;
    pMVar13 = (MapFieldBase *)local_b8._8_8_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar7 = ((KeyValue *)&pMVar13->_vptr_MapFieldBase)->uint32_value_;
      if (uVar7 < 0x80) {
        *target = (byte)uVar7;
        target = (uint8 *)((long)target + 1);
      }
      else {
        *target = (byte)uVar7 | 0x80;
        if (uVar7 < 0x4000) {
          *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
          target = (uint8 *)((long)target + 2);
        }
        else {
          target = (uint8 *)((long)target + 2);
          uVar7 = uVar7 >> 7;
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar7 | 0x80;
            uVar12 = uVar7 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar12;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar12;
        }
      }
      pMVar13 = (MapFieldBase *)((long)&pMVar13->_vptr_MapFieldBase + 4);
    } while (pMVar13 < (MapFieldBase *)((long)pKVar3 + lVar23 * 4));
LAB_002a78c9:
    RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)local_b8);
    break;
  case 0xe:
    pRVar20 = Reflection::GetRepeatedField<int>(this,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)local_b8,pRVar20);
    iVar8 = *(int *)(field + 0x44);
    sVar19 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = iVar8 << 3;
    if (uVar7 < 0x80) {
      *target = (byte)uVar7 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar7 = uVar7 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar7 | 0x80;
          uVar12 = uVar7 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar12;
        } while (bVar4);
        *pbVar34 = (byte)uVar12;
      }
    }
    if ((uint)sVar19 < 0x80) {
      uVar28 = sVar19 & 0xffffffff;
    }
    else {
      uVar28 = sVar19 & 0xffffffff;
      do {
        uVar7 = (uint)sVar19;
        *pbVar35 = (byte)sVar19 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar35 = pbVar35 + 1;
        sVar19 = uVar28;
      } while (0x3fff < uVar7);
    }
    *pbVar35 = (byte)uVar28;
    target = pbVar35 + 1;
    lVar23 = (long)(int)local_b8._0_4_;
    pKVar3 = (KeyValue *)local_b8._8_8_;
    pMVar13 = (MapFieldBase *)local_b8._8_8_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar7 = ((KeyValue *)&pMVar13->_vptr_MapFieldBase)->uint32_value_;
      if ((ulong)(long)(int)uVar7 < 0x80) {
        *target = (byte)uVar7;
        target = (uint8 *)((long)target + 1);
      }
      else {
        *target = (byte)uVar7 | 0x80;
        uVar28 = (ulong)(long)(int)uVar7 >> 7;
        if (uVar7 < 0x4000) {
          *(byte *)((long)target + 1) = (byte)uVar28;
          target = (uint8 *)((long)target + 2);
        }
        else {
          target = (uint8 *)((long)target + 2);
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar28 | 0x80;
            uVar24 = uVar28 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar28;
            uVar28 = uVar24;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar24;
        }
      }
      pMVar13 = (MapFieldBase *)((long)&pMVar13->_vptr_MapFieldBase + 4);
    } while (pMVar13 < (MapFieldBase *)((long)pKVar3 + lVar23 * 4));
    goto LAB_002a76b2;
  case 0xf:
    pRVar20 = Reflection::GetRepeatedField<int>(this,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)local_b8,pRVar20);
    iVar8 = *(int *)(field + 0x44);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = local_b8._0_4_ << 2;
    uVar12 = iVar8 << 3;
    if (uVar12 < 0x80) {
      *target = (byte)uVar12 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar12 | 0x82;
      if (uVar12 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar12 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar12 = uVar12 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar12 | 0x80;
          uVar10 = uVar12 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar12;
          uVar12 = uVar10;
        } while (bVar4);
        *pbVar34 = (byte)uVar10;
      }
    }
    uVar12 = uVar7;
    uVar10 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar35 = (byte)uVar10 | 0x80;
        pbVar35 = pbVar35 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar12 = uVar10 >> 7;
        uVar10 = uVar10 >> 7;
      } while (bVar4);
    }
    *pbVar35 = (byte)uVar12;
    pbVar35 = pbVar35 + 1;
    sVar29 = (size_t)(int)uVar7;
    if ((long)stream->end_ - (long)pbVar35 < (long)sVar29) {
      target = io::EpsCopyOutputStream::WriteRawFallback
                         (stream,(void *)local_b8._8_8_,uVar7,pbVar35);
    }
    else {
      memcpy(pbVar35,(void *)local_b8._8_8_,sVar29);
      target = pbVar35 + sVar29;
    }
    goto LAB_002a76b2;
  case 0x10:
    pRVar18 = Reflection::GetRepeatedField<long>(this,message,field);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)local_b8,pRVar18);
    iVar8 = *(int *)(field + 0x44);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = local_b8._0_4_ << 3;
    uVar12 = iVar8 << 3;
    if (uVar12 < 0x80) {
      *target = (byte)uVar12 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar12 | 0x82;
      if (uVar12 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar12 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar12 = uVar12 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar12 | 0x80;
          uVar10 = uVar12 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar12;
          uVar12 = uVar10;
        } while (bVar4);
        *pbVar34 = (byte)uVar10;
      }
    }
    uVar12 = uVar7;
    uVar10 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar35 = (byte)uVar10 | 0x80;
        pbVar35 = pbVar35 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar12 = uVar10 >> 7;
        uVar10 = uVar10 >> 7;
      } while (bVar4);
    }
    *pbVar35 = (byte)uVar12;
    pbVar35 = pbVar35 + 1;
    sVar29 = (size_t)(int)uVar7;
    if ((long)stream->end_ - (long)pbVar35 < (long)sVar29) {
      target = io::EpsCopyOutputStream::WriteRawFallback
                         (stream,(void *)local_b8._8_8_,uVar7,pbVar35);
    }
    else {
      memcpy(pbVar35,(void *)local_b8._8_8_,sVar29);
      target = pbVar35 + sVar29;
    }
    goto LAB_002a7788;
  case 0x11:
    pRVar20 = Reflection::GetRepeatedField<int>(this,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)local_b8,pRVar20);
    iVar8 = *(int *)(field + 0x44);
    sVar19 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = iVar8 << 3;
    if (uVar7 < 0x80) {
      *target = (byte)uVar7 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar7 = uVar7 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar7 | 0x80;
          uVar12 = uVar7 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar12;
        } while (bVar4);
        *pbVar34 = (byte)uVar12;
      }
    }
    if ((uint)sVar19 < 0x80) {
      uVar28 = sVar19 & 0xffffffff;
    }
    else {
      uVar28 = sVar19 & 0xffffffff;
      do {
        uVar7 = (uint)sVar19;
        *pbVar35 = (byte)sVar19 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar35 = pbVar35 + 1;
        sVar19 = uVar28;
      } while (0x3fff < uVar7);
    }
    *pbVar35 = (byte)uVar28;
    target = pbVar35 + 1;
    lVar23 = (long)(int)local_b8._0_4_;
    pKVar3 = (KeyValue *)local_b8._8_8_;
    pMVar13 = (MapFieldBase *)local_b8._8_8_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar7 = ((KeyValue *)&pMVar13->_vptr_MapFieldBase)->int32_value_ >> 0x1f ^
              ((KeyValue *)&pMVar13->_vptr_MapFieldBase)->int32_value_ * 2;
      if (uVar7 < 0x80) {
        *target = (byte)uVar7;
        target = (uint8 *)((long)target + 1);
      }
      else {
        *target = (byte)uVar7 | 0x80;
        if (uVar7 < 0x4000) {
          *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
          target = (uint8 *)((long)target + 2);
        }
        else {
          target = (uint8 *)((long)target + 2);
          uVar7 = uVar7 >> 7;
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar7 | 0x80;
            uVar12 = uVar7 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar12;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar12;
        }
      }
      pMVar13 = (MapFieldBase *)((long)&pMVar13->_vptr_MapFieldBase + 4);
    } while (pMVar13 < (MapFieldBase *)((long)pKVar3 + lVar23 * 4));
LAB_002a76b2:
    RepeatedField<int>::~RepeatedField((RepeatedField<int> *)local_b8);
    break;
  case 0x12:
    pRVar18 = Reflection::GetRepeatedField<long>(this,message,field);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)local_b8,pRVar18);
    iVar8 = *(int *)(field + 0x44);
    sVar19 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = iVar8 << 3;
    if (uVar7 < 0x80) {
      *target = (byte)uVar7 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar7 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar7 = uVar7 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar7 | 0x80;
          uVar12 = uVar7 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar12;
        } while (bVar4);
        *pbVar34 = (byte)uVar12;
      }
    }
    if ((uint)sVar19 < 0x80) {
      uVar28 = sVar19 & 0xffffffff;
    }
    else {
      uVar28 = sVar19 & 0xffffffff;
      do {
        uVar7 = (uint)sVar19;
        *pbVar35 = (byte)sVar19 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar35 = pbVar35 + 1;
        sVar19 = uVar28;
      } while (0x3fff < uVar7);
    }
    *pbVar35 = (byte)uVar28;
    target = pbVar35 + 1;
    lVar23 = (long)(int)local_b8._0_4_;
    pKVar3 = (KeyValue *)local_b8._8_8_;
    pMVar13 = (MapFieldBase *)local_b8._8_8_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar28 = ((KeyValue *)&pMVar13->_vptr_MapFieldBase)->int64_value_ >> 0x3f ^
               ((KeyValue *)&pMVar13->_vptr_MapFieldBase)->int64_value_ * 2;
      if (uVar28 < 0x80) {
        *target = (byte)uVar28;
        target = (uint8 *)((long)target + 1);
      }
      else {
        *target = (byte)uVar28 | 0x80;
        if (uVar28 < 0x4000) {
          *(byte *)((long)target + 1) = (byte)(uVar28 >> 7);
          target = (uint8 *)((long)target + 2);
        }
        else {
          uVar28 = uVar28 >> 7;
          target = (uint8 *)((long)target + 2);
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar28 | 0x80;
            uVar24 = uVar28 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar28;
            uVar28 = uVar24;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar24;
        }
      }
      pMVar13 = (MapFieldBase *)&pMVar13->arena_;
    } while (pMVar13 < pKVar3 + lVar23);
LAB_002a7788:
    RepeatedField<long>::~RepeatedField((RepeatedField<long> *)local_b8);
  }
LAB_002a793b:
  if ((MapFieldBase *)local_a8._48_8_ != (MapFieldBase *)0x0) {
    operator_delete((void *)local_a8._48_8_);
  }
  return (uint8 *)(double *)target;
}

Assistant:

uint8* WireFormat::InternalSerializeField(const FieldDescriptor* field,
                                          const Message& message, uint8* target,
                                          io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return InternalSerializeMessageSetItem(field, message, target, stream);
  }

  // For map fields, we can use either repeated field reflection or map
  // reflection.  Our choice has some subtle effects.  If we use repeated field
  // reflection here, then the repeated field representation becomes
  // authoritative for this field: any existing references that came from map
  // reflection remain valid for reading, but mutations to them are lost and
  // will be overwritten next time we call map reflection!
  //
  // So far this mainly affects Python, which keeps long-term references to map
  // values around, and always uses map reflection.  See: b/35918691
  //
  // Here we choose to use map reflection API as long as the internal
  // map is valid. In this way, the serialization doesn't change map field's
  // internal state and existing references that came from map reflection remain
  // valid for both reading and writing.
  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      if (stream->IsSerializationDeterministic()) {
        std::vector<MapKey> sorted_key_list =
            MapKeySorter::SortKey(message, message_reflection, field);
        for (std::vector<MapKey>::iterator it = sorted_key_list.begin();
             it != sorted_key_list.end(); ++it) {
          MapValueRef map_value;
          message_reflection->InsertOrLookupMapValue(
              const_cast<Message*>(&message), field, *it, &map_value);
          target =
              InternalSerializeMapEntry(field, *it, map_value, target, stream);
        }
      } else {
        for (MapIterator it = message_reflection->MapBegin(
                 const_cast<Message*>(&message), field);
             it !=
             message_reflection->MapEnd(const_cast<Message*>(&message), field);
             ++it) {
          target = InternalSerializeMapEntry(field, it.GetKey(),
                                             it.GetValueRef(), target, stream);
        }
      }

      return target;
    }
  }
  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  // map_entries is for maps that'll be deterministically serialized.
  std::vector<const Message*> map_entries;
  if (count > 1 && field->is_map() && stream->IsSerializationDeterministic()) {
    map_entries =
        DynamicMapSorter::Sort(message, count, message_reflection, field);
  }

  if (field->is_packed()) {
    if (count == 0) return target;
    stream->EnsureSpace(&target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)   \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    auto r = message_reflection->GetRepeatedField<CPPTYPE>(message, field); \
    target = stream->Write##TYPE_METHOD##Packed(                            \
        field->number(), r, FieldDataOnlyByteSize(field, message), target); \
    break;                                                                  \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64, UInt64, UInt64)
      HANDLE_PRIMITIVE_TYPE(ENUM, int, Enum, Enum)

#undef HANDLE_PRIMITIVE_TYPE
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)   \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    auto r = message_reflection->GetRepeatedField<CPPTYPE>(message, field); \
    target = stream->WriteFixedPacked(field->number(), r, target);          \
    break;                                                                  \
  }

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE
      default:
        GOOGLE_LOG(FATAL) << "Invalid descriptor";
    }
    return target;
  }

  for (int j = 0; j < count; j++) {
    stream->EnsureSpace(&target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)     \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    const CPPTYPE value =                                                     \
        field->is_repeated()                                                  \
            ? message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                              j)              \
            : message_reflection->Get##CPPTYPE_METHOD(message, field);        \
    target = WireFormatLite::Write##TYPE_METHOD##ToArray(field->number(),     \
                                                         value, target);      \
    break;                                                                    \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                         \
  case FieldDescriptor::TYPE_##TYPE:                                           \
    target = WireFormatLite::InternalWrite##TYPE_METHOD##ToArray(              \
        field->number(),                                                       \
        field->is_repeated()                                                   \
            ? (map_entries.empty()                                             \
                   ? message_reflection->GetRepeated##CPPTYPE_METHOD(message,  \
                                                                     field, j) \
                   : *map_entries[j])                                          \
            : message_reflection->Get##CPPTYPE_METHOD(message, field),         \
        target, stream);                                                       \
    break;

      HANDLE_TYPE(GROUP, Group, Message)
      HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value =
            field->is_repeated()
                ? message_reflection->GetRepeatedEnum(message, field, j)
                : message_reflection->GetEnum(message, field);
        target = WireFormatLite::WriteEnumToArray(field->number(),
                                                  value->number(), target);
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        if (strict_utf8_check) {
          WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                           WireFormatLite::SERIALIZE,
                                           field->full_name().c_str());
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), SERIALIZE,
                                     field->full_name().c_str());
        }
        target = stream->WriteString(field->number(), value, target);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        target = stream->WriteString(field->number(), value, target);
        break;
      }
    }
  }
  return target;
}